

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# divsufsort.c
# Opt level: O2

saint_t divsufsort(sauchar_t *T,saidx_t *SA,saidx_t n)

{
  byte bVar1;
  byte bVar2;
  int iVar3;
  saidx_t sVar4;
  uint uVar5;
  saidx_t *bucket_A;
  saidx_t *bucket_B;
  ulong uVar6;
  uint uVar7;
  uint *puVar8;
  uint uVar9;
  uint *puVar10;
  ulong uVar11;
  uint uVar12;
  saint_t sVar13;
  
  if (n < 0 || (SA == (saidx_t *)0x0 || T == (sauchar_t *)0x0)) {
    n = -1;
  }
  else if (n != 0) {
    if (n == 2) {
      bVar2 = *T;
      bVar1 = T[1];
      SA[bVar2 >= bVar1] = 0;
      SA[bVar2 < bVar1] = 1;
    }
    else {
      if (n != 1) {
        bucket_A = (saidx_t *)malloc(0x400);
        bucket_B = (saidx_t *)malloc(0x40000);
        if (bucket_B == (saidx_t *)0x0 || bucket_A == (saidx_t *)0x0) {
          sVar13 = -2;
        }
        else {
          sVar4 = sort_typeBstar(T,SA,bucket_A,bucket_B,n);
          if (0 < sVar4) {
            for (uVar5 = 0xfe; -1 < (int)uVar5; uVar5 = uVar5 - 1) {
              uVar7 = uVar5 << 8;
              iVar3 = bucket_B[(int)(uVar5 + 1 | uVar7)];
              puVar10 = (uint *)(SA + bucket_A[(ulong)uVar5 + 1]);
              puVar8 = (uint *)0x0;
              uVar6 = 0xffffffffffffffff;
              while (puVar10 = puVar10 + -1, SA + iVar3 <= puVar10) {
                uVar12 = *puVar10;
                *puVar10 = ~uVar12;
                if (0 < (long)(int)uVar12) {
                  bVar2 = T[uVar12 - 1];
                  uVar11 = (ulong)bVar2;
                  uVar9 = 0;
                  if ((uVar12 != 1) && (uVar9 = uVar12 - 1, bVar2 < T[(long)(int)uVar12 + -2])) {
                    uVar9 = -uVar12;
                  }
                  uVar12 = (uint)uVar6;
                  if (uVar12 == bVar2) {
                    uVar11 = uVar6 & 0xffffffff;
                  }
                  else {
                    if (-1 < (int)uVar12) {
                      bucket_B[(int)(uVar12 | uVar7)] =
                           (saidx_t)((ulong)((long)puVar8 - (long)SA) >> 2);
                    }
                    puVar8 = (uint *)(SA + bucket_B[(long)(int)uVar7 | uVar11]);
                  }
                  *puVar8 = uVar9;
                  puVar8 = puVar8 + -1;
                  uVar6 = uVar11;
                }
              }
            }
          }
          uVar6 = (ulong)T[n - 1U];
          uVar5 = -n;
          if (T[n - 1U] <= T[(ulong)(uint)n - 2]) {
            uVar5 = n - 1U;
          }
          puVar10 = (uint *)(SA + bucket_A[uVar6] + 1);
          SA[bucket_A[uVar6]] = uVar5;
          for (puVar8 = (uint *)SA; puVar8 < SA + (uint)n; puVar8 = puVar8 + 1) {
            uVar5 = *puVar8;
            if ((long)(int)uVar5 < 1) {
              *puVar8 = ~uVar5;
            }
            else {
              uVar7 = uVar5 - 1;
              uVar11 = (ulong)uVar7;
              if ((uVar7 == 0) || (T[(long)(int)uVar5 + -2] < T[uVar11])) {
                uVar7 = -uVar5;
              }
              uVar5 = (uint)T[uVar11];
              if ((uint)uVar6 != uVar5) {
                bucket_A[uVar6] = (saidx_t)((ulong)((long)puVar10 - (long)SA) >> 2);
                puVar10 = (uint *)(SA + bucket_A[uVar5]);
                uVar6 = (ulong)uVar5;
              }
              *puVar10 = uVar7;
              puVar10 = puVar10 + 1;
            }
          }
          sVar13 = 0;
        }
        free(bucket_B);
        free(bucket_A);
        return sVar13;
      }
      *SA = 0;
    }
    n = 0;
  }
  return n;
}

Assistant:

saint_t
divsufsort(const sauchar_t *T, saidx_t *SA, saidx_t n) {
  saidx_t *bucket_A, *bucket_B;
  saidx_t m;
  saint_t err = 0;

  /* Check arguments. */
  if((T == NULL) || (SA == NULL) || (n < 0)) { return -1; }
  else if(n == 0) { return 0; }
  else if(n == 1) { SA[0] = 0; return 0; }
  else if(n == 2) { m = (T[0] < T[1]); SA[m ^ 1] = 0, SA[m] = 1; return 0; }

  bucket_A = (saidx_t *)malloc(BUCKET_A_SIZE * sizeof(saidx_t));
  bucket_B = (saidx_t *)malloc(BUCKET_B_SIZE * sizeof(saidx_t));

  /* Suffixsort. */
  if((bucket_A != NULL) && (bucket_B != NULL)) {
    m = sort_typeBstar(T, SA, bucket_A, bucket_B, n);
    construct_SA(T, SA, bucket_A, bucket_B, n, m);
  } else {
    err = -2;
  }

  free(bucket_B);
  free(bucket_A);

  return err;
}